

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprBalance(Fts3Expr **pp,int nMaxDepth)

{
  Fts3Expr *pFVar1;
  Fts3Expr *local_70;
  Fts3Expr *pRight;
  Fts3Expr *pLeft;
  Fts3Expr *pDel;
  Fts3Expr *pParent;
  Fts3Expr *pFStack_48;
  int iLvl;
  Fts3Expr *p;
  void *pvStack_38;
  int i;
  Fts3Expr **apLeaf;
  Fts3Expr *pFStack_28;
  int eType;
  Fts3Expr *pFree;
  Fts3Expr *pRoot;
  int rc;
  int nMaxDepth_local;
  Fts3Expr **pp_local;
  
  pFree = *pp;
  pFStack_28 = (Fts3Expr *)0x0;
  apLeaf._4_4_ = pFree->eType;
  pRoot._0_4_ = (uint)(nMaxDepth == 0);
  pRoot._4_4_ = nMaxDepth;
  _rc = pp;
  if ((uint)pRoot == 0) {
    if ((apLeaf._4_4_ == 3) || (apLeaf._4_4_ == 4)) {
      pvStack_38 = sqlite3_malloc64((long)nMaxDepth << 3);
      if (pvStack_38 == (void *)0x0) {
        pRoot._0_4_ = 7;
      }
      else {
        memset(pvStack_38,0,(long)pRoot._4_4_ << 3);
      }
      if ((uint)pRoot == 0) {
        for (pFStack_48 = pFree; pFStack_48->eType == apLeaf._4_4_; pFStack_48 = pFStack_48->pLeft)
        {
        }
        while( true ) {
          pDel = pFStack_48->pParent;
          pFStack_48->pParent = (Fts3Expr *)0x0;
          if (pDel == (Fts3Expr *)0x0) {
            pFree = (Fts3Expr *)0x0;
          }
          else {
            pDel->pLeft = (Fts3Expr *)0x0;
          }
          pRoot._0_4_ = fts3ExprBalance(&stack0xffffffffffffffb8,pRoot._4_4_ + -1);
          if ((uint)pRoot != 0) goto LAB_001fda9c;
          for (pParent._4_4_ = 0; pFStack_48 != (Fts3Expr *)0x0 && pParent._4_4_ < pRoot._4_4_;
              pParent._4_4_ = pParent._4_4_ + 1) {
            if (*(long *)((long)pvStack_38 + (long)pParent._4_4_ * 8) == 0) {
              *(Fts3Expr **)((long)pvStack_38 + (long)pParent._4_4_ * 8) = pFStack_48;
              pFStack_48 = (Fts3Expr *)0x0;
            }
            else {
              pFStack_28->pLeft = *(Fts3Expr **)((long)pvStack_38 + (long)pParent._4_4_ * 8);
              pFStack_28->pRight = pFStack_48;
              pFStack_28->pLeft->pParent = pFStack_28;
              pFStack_28->pRight->pParent = pFStack_28;
              pFStack_48 = pFStack_28;
              pFVar1 = pFStack_28->pParent;
              pFStack_28->pParent = (Fts3Expr *)0x0;
              *(undefined8 *)((long)pvStack_38 + (long)pParent._4_4_ * 8) = 0;
              pFStack_28 = pFVar1;
            }
          }
          if (pFStack_48 != (Fts3Expr *)0x0) break;
          if (pDel == (Fts3Expr *)0x0) goto LAB_001fda9c;
          for (pFStack_48 = pDel->pRight; pFStack_48->eType == apLeaf._4_4_;
              pFStack_48 = pFStack_48->pLeft) {
          }
          pDel->pRight->pParent = pDel->pParent;
          if (pDel->pParent == (Fts3Expr *)0x0) {
            pFree = pDel->pRight;
          }
          else {
            pDel->pParent->pLeft = pDel->pRight;
          }
          pDel->pParent = pFStack_28;
          pFStack_28 = pDel;
          pRoot._0_4_ = 0;
        }
        sqlite3Fts3ExprFree(pFStack_48);
        pRoot._0_4_ = 0x12;
LAB_001fda9c:
        if ((uint)pRoot == 0) {
          pFStack_48 = (Fts3Expr *)0x0;
          for (p._4_4_ = 0; p._4_4_ < pRoot._4_4_; p._4_4_ = p._4_4_ + 1) {
            if (*(long *)((long)pvStack_38 + (long)p._4_4_ * 8) != 0) {
              if (pFStack_48 == (Fts3Expr *)0x0) {
                pFStack_48 = *(Fts3Expr **)((long)pvStack_38 + (long)p._4_4_ * 8);
                pFStack_48->pParent = (Fts3Expr *)0x0;
              }
              else {
                pFStack_28->pRight = pFStack_48;
                pFStack_28->pLeft = *(Fts3Expr **)((long)pvStack_38 + (long)p._4_4_ * 8);
                pFStack_28->pLeft->pParent = pFStack_28;
                pFStack_28->pRight->pParent = pFStack_28;
                pFStack_48 = pFStack_28;
                pFVar1 = pFStack_28->pParent;
                pFStack_28->pParent = (Fts3Expr *)0x0;
                pFStack_28 = pFVar1;
              }
            }
          }
          pFree = pFStack_48;
        }
        else {
          for (p._4_4_ = 0; p._4_4_ < pRoot._4_4_; p._4_4_ = p._4_4_ + 1) {
            sqlite3Fts3ExprFree(*(Fts3Expr **)((long)pvStack_38 + (long)p._4_4_ * 8));
          }
          while (pFVar1 = pFStack_28, pLeft = pFStack_28, pFStack_28 != (Fts3Expr *)0x0) {
            pFStack_28 = pFStack_28->pParent;
            sqlite3_free(pFVar1);
          }
        }
        sqlite3_free(pvStack_38);
      }
    }
    else if (apLeaf._4_4_ == 2) {
      pRight = pFree->pLeft;
      local_70 = pFree->pRight;
      pFree->pLeft = (Fts3Expr *)0x0;
      pFree->pRight = (Fts3Expr *)0x0;
      pRight->pParent = (Fts3Expr *)0x0;
      local_70->pParent = (Fts3Expr *)0x0;
      pRoot._0_4_ = fts3ExprBalance(&pRight,nMaxDepth + -1);
      if ((uint)pRoot == 0) {
        pRoot._0_4_ = fts3ExprBalance(&local_70,pRoot._4_4_ + -1);
      }
      if ((uint)pRoot == 0) {
        pFree->pLeft = pRight;
        pRight->pParent = pFree;
        pFree->pRight = local_70;
        local_70->pParent = pFree;
      }
      else {
        sqlite3Fts3ExprFree(local_70);
        sqlite3Fts3ExprFree(pRight);
      }
    }
  }
  if ((uint)pRoot != 0) {
    sqlite3Fts3ExprFree(pFree);
    pFree = (Fts3Expr *)0x0;
  }
  *_rc = pFree;
  return (uint)pRoot;
}

Assistant:

static int fts3ExprBalance(Fts3Expr **pp, int nMaxDepth){
  int rc = SQLITE_OK;             /* Return code */
  Fts3Expr *pRoot = *pp;          /* Initial root node */
  Fts3Expr *pFree = 0;            /* List of free nodes. Linked by pParent. */
  int eType = pRoot->eType;       /* Type of node in this tree */

  if( nMaxDepth==0 ){
    rc = SQLITE_ERROR;
  }

  if( rc==SQLITE_OK ){
    if( (eType==FTSQUERY_AND || eType==FTSQUERY_OR) ){
      Fts3Expr **apLeaf;
      apLeaf = (Fts3Expr **)sqlite3_malloc64(sizeof(Fts3Expr *) * nMaxDepth);
      if( 0==apLeaf ){
        rc = SQLITE_NOMEM;
      }else{
        memset(apLeaf, 0, sizeof(Fts3Expr *) * nMaxDepth);
      }

      if( rc==SQLITE_OK ){
        int i;
        Fts3Expr *p;

        /* Set $p to point to the left-most leaf in the tree of eType nodes. */
        for(p=pRoot; p->eType==eType; p=p->pLeft){
          assert( p->pParent==0 || p->pParent->pLeft==p );
          assert( p->pLeft && p->pRight );
        }

        /* This loop runs once for each leaf in the tree of eType nodes. */
        while( 1 ){
          int iLvl;
          Fts3Expr *pParent = p->pParent;     /* Current parent of p */

          assert( pParent==0 || pParent->pLeft==p );
          p->pParent = 0;
          if( pParent ){
            pParent->pLeft = 0;
          }else{
            pRoot = 0;
          }
          rc = fts3ExprBalance(&p, nMaxDepth-1);
          if( rc!=SQLITE_OK ) break;

          for(iLvl=0; p && iLvl<nMaxDepth; iLvl++){
            if( apLeaf[iLvl]==0 ){
              apLeaf[iLvl] = p;
              p = 0;
            }else{
              assert( pFree );
              pFree->pLeft = apLeaf[iLvl];
              pFree->pRight = p;
              pFree->pLeft->pParent = pFree;
              pFree->pRight->pParent = pFree;

              p = pFree;
              pFree = pFree->pParent;
              p->pParent = 0;
              apLeaf[iLvl] = 0;
            }
          }
          if( p ){
            sqlite3Fts3ExprFree(p);
            rc = SQLITE_TOOBIG;
            break;
          }

          /* If that was the last leaf node, break out of the loop */
          if( pParent==0 ) break;

          /* Set $p to point to the next leaf in the tree of eType nodes */
          for(p=pParent->pRight; p->eType==eType; p=p->pLeft);

          /* Remove pParent from the original tree. */
          assert( pParent->pParent==0 || pParent->pParent->pLeft==pParent );
          pParent->pRight->pParent = pParent->pParent;
          if( pParent->pParent ){
            pParent->pParent->pLeft = pParent->pRight;
          }else{
            assert( pParent==pRoot );
            pRoot = pParent->pRight;
          }

          /* Link pParent into the free node list. It will be used as an
          ** internal node of the new tree.  */
          pParent->pParent = pFree;
          pFree = pParent;
        }

        if( rc==SQLITE_OK ){
          p = 0;
          for(i=0; i<nMaxDepth; i++){
            if( apLeaf[i] ){
              if( p==0 ){
                p = apLeaf[i];
                p->pParent = 0;
              }else{
                assert( pFree!=0 );
                pFree->pRight = p;
                pFree->pLeft = apLeaf[i];
                pFree->pLeft->pParent = pFree;
                pFree->pRight->pParent = pFree;

                p = pFree;
                pFree = pFree->pParent;
                p->pParent = 0;
              }
            }
          }
          pRoot = p;
        }else{
          /* An error occurred. Delete the contents of the apLeaf[] array 
          ** and pFree list. Everything else is cleaned up by the call to
          ** sqlite3Fts3ExprFree(pRoot) below.  */
          Fts3Expr *pDel;
          for(i=0; i<nMaxDepth; i++){
            sqlite3Fts3ExprFree(apLeaf[i]);
          }
          while( (pDel=pFree)!=0 ){
            pFree = pDel->pParent;
            sqlite3_free(pDel);
          }
        }

        assert( pFree==0 );
        sqlite3_free( apLeaf );
      }
    }else if( eType==FTSQUERY_NOT ){
      Fts3Expr *pLeft = pRoot->pLeft;
      Fts3Expr *pRight = pRoot->pRight;

      pRoot->pLeft = 0;
      pRoot->pRight = 0;
      pLeft->pParent = 0;
      pRight->pParent = 0;

      rc = fts3ExprBalance(&pLeft, nMaxDepth-1);
      if( rc==SQLITE_OK ){
        rc = fts3ExprBalance(&pRight, nMaxDepth-1);
      }

      if( rc!=SQLITE_OK ){
        sqlite3Fts3ExprFree(pRight);
        sqlite3Fts3ExprFree(pLeft);
      }else{
        assert( pLeft && pRight );
        pRoot->pLeft = pLeft;
        pLeft->pParent = pRoot;
        pRoot->pRight = pRight;
        pRight->pParent = pRoot;
      }
    }
  }
  
  if( rc!=SQLITE_OK ){
    sqlite3Fts3ExprFree(pRoot);
    pRoot = 0;
  }
  *pp = pRoot;
  return rc;
}